

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

void __thiscall ExecutorRegVm::ExecutorRegVm(ExecutorRegVm *this,Linker *linker)

{
  char *pcVar1;
  
  this->exLinker = linker;
  this->exTypes = &linker->exTypes;
  this->exFunctions = &linker->exFunctions;
  (this->dataStack).data = (char *)0x0;
  (this->dataStack).max = 0;
  (this->dataStack).count = 0;
  (this->callStack).data = (RegVmCmd **)0x0;
  (this->callStack).max = 0;
  (this->callStack).count = 0;
  (this->breakCode).data = (RegVmCmd *)0x0;
  (this->breakCode).max = 0;
  (this->breakCode).count = 0;
  pcVar1 = (char *)(*(code *)NULLC::alloc)(0x10000);
  this->execErrorBuffer = pcVar1;
  *pcVar1 = '\0';
  memset(this->execResult,0,0x200);
  this->codeRunning = false;
  this->symbols = (char *)0x0;
  this->codeBase = (RegVmCmd *)0x0;
  this->minStackSize = 0x100000;
  this->tempStackType = 0;
  this->tempStackArrayBase = (uint *)0x0;
  this->tempStackArrayEnd = (uint *)0x0;
  this->regFileArrayBase = (RegVmRegister *)0x0;
  this->regFileLastTop = (RegVmRegister *)0x0;
  this->regFileArrayEnd = (RegVmRegister *)0x0;
  this->callContinue = true;
  this->breakFunctionContext = (void *)0x0;
  this->breakFunction = (_func_uint_void_ptr_uint *)0x0;
  return;
}

Assistant:

ExecutorRegVm::ExecutorRegVm(Linker* linker) : exLinker(linker), exTypes(linker->exTypes), exFunctions(linker->exFunctions)
{
	execErrorBuffer = (char*)NULLC::alloc(NULLC_ERROR_BUFFER_SIZE);
	*execErrorBuffer = 0;

	memset(execResult, 0, execResultSize);

	codeRunning = false;

	symbols = NULL;

	codeBase = NULL;

	minStackSize = 1 * 1024 * 1024;

	tempStackType = NULLC_TYPE_VOID;
	tempStackArrayBase = NULL;
	tempStackArrayEnd = NULL;

	regFileArrayBase = NULL;
	regFileLastTop = NULL;
	regFileArrayEnd = NULL;

	callContinue = true;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	dcCallVM = NULL;
#endif

	breakFunctionContext = NULL;
	breakFunction = NULL;
}